

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraSublimeTextGenerator::ComputeDefines_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  char *pcVar1;
  string local_168;
  allocator local_141;
  undefined1 local_140 [8];
  string defPropName;
  string local_118;
  char *local_f8;
  char *exportMacro;
  string local_e8;
  string local_c8;
  string *local_a8;
  string *config;
  string *local_80;
  string *language;
  cmMakefile *local_68;
  cmMakefile *makefile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *lg_local;
  cmSourceFile *source_local;
  cmExtraSublimeTextGenerator *this_local;
  string *definesString;
  
  defines._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)target;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&makefile);
  local_68 = cmLocalGenerator::GetMakefile(lg);
  cmSourceFile::GetLanguage_abi_cxx11_((string *)&config,source);
  this_00 = local_68;
  local_80 = (string *)&config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,"CMAKE_BUILD_TYPE",(allocator *)((long)&exportMacro + 7));
  pcVar1 = cmMakefile::GetSafeDefinition(this_00,&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,pcVar1,(allocator *)((long)&exportMacro + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&exportMacro + 6));
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&exportMacro + 7));
  local_a8 = &local_c8;
  local_f8 = cmGeneratorTarget::GetExportMacro
                       ((cmGeneratorTarget *)
                        defines._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (local_f8 != (char *)0x0) {
    cmLocalGenerator::AppendDefines
              (lg,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&makefile,local_f8);
  }
  cmLocalGenerator::AddCompileDefinitions
            (lg,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&makefile,
             (cmGeneratorTarget *)defines._M_t._M_impl.super__Rb_tree_header._M_node_count,local_a8,
             local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,"COMPILE_DEFINITIONS",
             (allocator *)(defPropName.field_2._M_local_buf + 0xf));
  pcVar1 = cmSourceFile::GetProperty(source,&local_118);
  cmLocalGenerator::AppendDefines
            (lg,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&makefile,pcVar1);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)(defPropName.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_140,"COMPILE_DEFINITIONS_",&local_141);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  cmsys::SystemTools::UpperCase(&local_168,local_a8);
  std::__cxx11::string::operator+=((string *)local_140,(string *)&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  pcVar1 = cmSourceFile::GetProperty(source,(string *)local_140);
  cmLocalGenerator::AppendDefines
            (lg,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&makefile,pcVar1);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cmLocalGenerator::JoinDefines
            (lg,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&makefile,__return_storage_ptr__,local_80);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&config);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&makefile);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::ComputeDefines(
  cmSourceFile* source, cmLocalGenerator* lg, cmGeneratorTarget* target)

{
  std::set<std::string> defines;
  cmMakefile* makefile = lg->GetMakefile();
  const std::string& language = source->GetLanguage();
  const std::string& config = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");

  // Add the export symbol definition for shared library objects.
  if (const char* exportMacro = target->GetExportMacro()) {
    lg->AppendDefines(defines, exportMacro);
  }

  // Add preprocessor definitions for this target and configuration.
  lg->AddCompileDefinitions(defines, target, config, language);
  lg->AppendDefines(defines, source->GetProperty("COMPILE_DEFINITIONS"));
  {
    std::string defPropName = "COMPILE_DEFINITIONS_";
    defPropName += cmSystemTools::UpperCase(config);
    lg->AppendDefines(defines, source->GetProperty(defPropName));
  }

  std::string definesString;
  lg->JoinDefines(defines, definesString, language);

  return definesString;
}